

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc.c
# Opt level: O0

void sbox_aux_s256_lowmc_255_255_4(mzd_local_t *statein,mzd_local_t *stateout,randomTape_t *tapes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  word256 v;
  word256 v_00;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  long in_RDX;
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  ulong uVar16;
  ulong uVar17;
  ulong width;
  bitstream_t *bs;
  bitstream_t aux_tape;
  bitstream_t last_party_tape;
  bitstream_t parity_tape;
  word256 t0;
  word256 t1;
  word256 t2;
  word256 fresh_output_bc;
  word256 fresh_output_ca;
  word256 fresh_output_ab;
  word256 f;
  word256 e;
  word256 d;
  word256 c;
  word256 b;
  word256 a;
  word256 aux;
  word256 bitc;
  word256 bitb;
  word256 bita;
  undefined8 local_e80;
  size_t size;
  size_t width_00;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  bitstream_t *bs_00;
  undefined8 uStack_e28;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  
  auVar1 = vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  uStack_bd0 = auVar2._0_8_;
  uStack_bc8 = auVar2._8_8_;
  auVar2 = vpunpcklqdq_avx(ZEXT816(0x4924924924924924),ZEXT816(0x2492492492492492));
  auVar3 = vpunpcklqdq_avx(ZEXT816(0x9249249249249249),ZEXT816(0x4924924924924924));
  uStack_c10 = auVar3._0_8_;
  uStack_c08 = auVar3._8_8_;
  auVar3 = vpunpcklqdq_avx(ZEXT816(0x9249249249249248),ZEXT816(0x4924924924924924));
  auVar4 = vpunpcklqdq_avx(ZEXT816(0x2492492492492492),ZEXT816(0x9249249249249249));
  uStack_c50 = auVar4._0_8_;
  uStack_c48 = auVar4._8_8_;
  auVar9._16_8_ = uStack_bd0;
  auVar9._0_16_ = auVar1;
  auVar9._24_8_ = uStack_bc8;
  auVar5 = vpand_avx2(auVar9,*in_RDI);
  auVar8._16_8_ = uStack_c10;
  auVar8._0_16_ = auVar2;
  auVar8._24_8_ = uStack_c08;
  auVar6 = vpand_avx2(auVar8,*in_RDI);
  auVar7._16_8_ = uStack_c50;
  auVar7._0_16_ = auVar3;
  auVar7._24_8_ = uStack_c48;
  auVar7 = vpand_avx2(auVar7,*in_RDI);
  auVar10 = vpsllq_avx2(auVar5,ZEXT416(2));
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x3e));
  auVar5 = vpermq_avx2(auVar5,0x93);
  auVar8 = vpor_avx2(auVar10,auVar5);
  auVar5 = vpsllq_avx2(auVar6,ZEXT416(1));
  auVar6 = vpsrlq_avx2(auVar6,ZEXT416(0x3f));
  auVar6 = vpermq_avx2(auVar6,0x93);
  auVar9 = vpor_avx2(auVar5,auVar6);
  auVar5._16_8_ = uStack_bd0;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_bc8;
  auVar5 = vpand_avx2(auVar5,*in_RSI);
  auVar6._16_8_ = uStack_c10;
  auVar6._0_16_ = auVar2;
  auVar6._24_8_ = uStack_c08;
  auVar6 = vpand_avx2(auVar6,*in_RSI);
  auVar10._16_8_ = uStack_c50;
  auVar10._0_16_ = auVar3;
  auVar10._24_8_ = uStack_c48;
  auVar10 = vpand_avx2(auVar10,*in_RSI);
  auVar11 = vpsllq_avx2(auVar5,ZEXT416(2));
  auVar5 = vpsrlq_avx2(auVar5,ZEXT416(0x3e));
  auVar5 = vpermq_avx2(auVar5,0x93);
  auVar5 = vpor_avx2(auVar11,auVar5);
  auVar11 = vpsllq_avx2(auVar6,ZEXT416(1));
  auVar6 = vpsrlq_avx2(auVar6,ZEXT416(0x3f));
  auVar6 = vpermq_avx2(auVar6,0x93);
  auVar6 = vpor_avx2(auVar11,auVar6);
  local_d20 = auVar8._0_8_;
  uStack_d18 = auVar8._8_8_;
  uStack_d10 = auVar8._16_8_;
  uStack_d08 = auVar8._24_8_;
  local_d40 = auVar9._0_8_;
  uStack_d38 = auVar9._8_8_;
  uStack_d30 = auVar9._16_8_;
  uStack_d28 = auVar9._24_8_;
  local_da0 = auVar6._0_8_;
  uStack_d98 = auVar6._8_8_;
  uStack_d90 = auVar6._16_8_;
  uStack_d88 = auVar6._24_8_;
  local_da0 = local_da0 ^ local_d20 ^ local_d40;
  uStack_d98 = uStack_d98 ^ uStack_d18 ^ uStack_d38;
  uStack_d90 = uStack_d90 ^ uStack_d10 ^ uStack_d30;
  uStack_d88 = uStack_d88 ^ uStack_d08 ^ uStack_d28;
  local_d80 = auVar5._0_8_;
  uStack_d78 = auVar5._8_8_;
  uStack_d70 = auVar5._16_8_;
  uStack_d68 = auVar5._24_8_;
  local_d60 = auVar7._0_8_;
  uStack_d58 = auVar7._8_8_;
  uStack_d50 = auVar7._16_8_;
  uStack_d48 = auVar7._24_8_;
  local_dc0 = auVar10._0_8_;
  uStack_db8 = auVar10._8_8_;
  uStack_db0 = auVar10._16_8_;
  uStack_da8 = auVar10._24_8_;
  auVar15._8_8_ = uStack_d98;
  auVar15._0_8_ = local_da0;
  auVar15._16_8_ = uStack_d90;
  auVar15._24_8_ = uStack_d88;
  auVar6 = vpsrlq_avx2(auVar15,ZEXT416(2));
  auVar13._8_8_ = uStack_d98;
  auVar13._0_8_ = local_da0;
  auVar13._16_8_ = uStack_d90;
  auVar13._24_8_ = uStack_d88;
  auVar5 = vpsllq_avx2(auVar13,ZEXT416(0x3e));
  auVar5 = vpermq_avx2(auVar5,0x39);
  auVar10 = vpor_avx2(auVar6,auVar5);
  auVar14._8_8_ = uStack_d78 ^ uStack_d18;
  auVar14._0_8_ = local_d80 ^ local_d20;
  auVar14._16_8_ = uStack_d70 ^ uStack_d10;
  auVar14._24_8_ = uStack_d68 ^ uStack_d08;
  auVar6 = vpsrlq_avx2(auVar14,ZEXT416(1));
  auVar11._8_8_ = uStack_d78 ^ uStack_d18;
  auVar11._0_8_ = local_d80 ^ local_d20;
  auVar11._16_8_ = uStack_d70 ^ uStack_d10;
  auVar11._24_8_ = uStack_d68 ^ uStack_d08;
  auVar5 = vpsllq_avx2(auVar11,ZEXT416(0x3f));
  auVar5 = vpermq_avx2(auVar5,0x39);
  auVar11 = vpor_avx2(auVar6,auVar5);
  uStack_e48 = auVar11._24_8_;
  local_e40 = auVar10._0_8_;
  uStack_e38 = auVar10._8_8_;
  uStack_e28 = auVar10._24_8_;
  uVar16 = local_e40 ^ auVar11._0_8_;
  uVar17 = uStack_e38 ^ auVar11._8_8_;
  uVar12 = uStack_e28 ^ uStack_e48;
  auVar5 = vpand_avx2(auVar8,auVar9);
  local_e80 = auVar5._0_8_;
  auVar6 = vpand_avx2(auVar9,auVar7);
  auVar7 = vpand_avx2(auVar7,auVar8);
  auVar8 = vpsrlq_avx2(auVar7,ZEXT416(2));
  auVar7 = vpsllq_avx2(auVar7,ZEXT416(0x3e));
  auVar7 = vpermq_avx2(auVar7,0x39);
  auVar7 = vpor_avx2(auVar8,auVar7);
  auVar8 = vpsrlq_avx2(auVar6,ZEXT416(1));
  auVar6 = vpsllq_avx2(auVar6,ZEXT416(0x3f));
  auVar6 = vpermq_avx2(auVar6,0x39);
  auVar6 = vpor_avx2(auVar8,auVar6);
  uStack_e48 = auVar6._24_8_;
  local_e40 = auVar7._0_8_;
  uStack_e38 = auVar7._8_8_;
  bs_00 = auVar7._16_8_;
  uStack_e28 = auVar7._24_8_;
  uVar16 = uVar16 ^ local_d20 ^ local_d40 ^ local_d60 ^ local_dc0 ^ local_e40 ^
           local_e80 ^ auVar6._0_8_;
  uVar17 = uVar17 ^ uStack_d18 ^ uStack_d38 ^ uStack_d58 ^ uStack_db8 ^ uStack_e38 ^
           auVar5._8_8_ ^ auVar6._8_8_;
  width = auVar10._16_8_ ^ auVar11._16_8_ ^ uStack_d10 ^ uStack_d30 ^ uStack_d50 ^ uStack_db0 ^
          (ulong)bs_00 ^ auVar5._16_8_ ^ auVar6._16_8_;
  bs = (bitstream_t *)
       (uVar12 ^ uStack_d08 ^ uStack_d28 ^ uStack_d48 ^ uStack_da8 ^ uStack_e28 ^
       (ulong)auVar5._24_8_ ^ uStack_e48);
  w256_from_bitstream(auVar5._24_8_,auVar5._16_8_,auVar5._8_8_);
  size = uVar17;
  width_00 = width;
  w256_from_bitstream(bs,width,uVar17);
  v[1] = uVar16;
  v[0] = (longlong)bs;
  v[2] = uVar17;
  v[3] = width;
  w256_to_bitstream(bs_00,v,width_00,size);
  v_00[1] = uVar16;
  v_00[0] = (longlong)bs;
  v_00[2] = uVar17;
  v_00[3] = width;
  w256_to_bitstream(bs_00,v_00,width_00,size);
  *(int *)(in_RDX + 0x94) = *(int *)(in_RDX + 0x94) + 0xff;
  return;
}

Assistant:

ATTR_TARGET_AVX2
static void sbox_aux_s256_lowmc_255_255_4(mzd_local_t* statein, mzd_local_t* stateout,
                                          randomTape_t* tapes) {
  picnic3_aux_sbox_bitsliced_mm256(LOWMC_255_255_4_N,
                                   mm256_set_4(MASK_255_255_85_A_0, MASK_255_255_85_A_1,
                                               MASK_255_255_85_A_2, MASK_255_255_85_A_3),
                                   mm256_set_4(MASK_255_255_85_B_0, MASK_255_255_85_B_1,
                                               MASK_255_255_85_B_2, MASK_255_255_85_B_3),
                                   mm256_set_4(MASK_255_255_85_C_0, MASK_255_255_85_C_1,
                                               MASK_255_255_85_C_2, MASK_255_255_85_C_3));
}